

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_set_blend_color(ALLEGRO_COLOR color)

{
  thread_local_state *ptVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  thread_local_state *tls;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    (ptVar1->current_blender).blend_color.r = (float)(int)in_XMM0_Qa;
    (ptVar1->current_blender).blend_color.g = (float)(int)((ulong)in_XMM0_Qa >> 0x20);
    (ptVar1->current_blender).blend_color.b = (float)(int)in_XMM1_Qa;
    (ptVar1->current_blender).blend_color.a = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  }
  return;
}

Assistant:

void al_set_blend_color(ALLEGRO_COLOR color)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;

   tls->current_blender.blend_color = color;
}